

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UnarySelectPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnarySelectPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3,
          PropertyExprSyntax *args_4)

{
  SelectorSyntax *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  UnarySelectPropertyExprSyntax *pUVar17;
  
  pUVar17 = (UnarySelectPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((UnarySelectPropertyExprSyntax *)this->endPtr < pUVar17 + 1) {
    pUVar17 = (UnarySelectPropertyExprSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pUVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  pSVar1 = *args_2;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pUVar17->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar17->super_PropertyExprSyntax).super_SyntaxNode.kind = UnarySelectPropertyExpr;
  (pUVar17->op).kind = TVar5;
  (pUVar17->op).field_0x2 = uVar6;
  (pUVar17->op).numFlags = (NumericTokenFlags)NVar7.raw;
  (pUVar17->op).rawLen = uVar8;
  (pUVar17->op).info = pIVar2;
  (pUVar17->openBracket).kind = TVar9;
  (pUVar17->openBracket).field_0x2 = uVar10;
  (pUVar17->openBracket).numFlags = (NumericTokenFlags)NVar11.raw;
  (pUVar17->openBracket).rawLen = uVar12;
  (pUVar17->openBracket).info = pIVar3;
  pUVar17->selector = pSVar1;
  (pUVar17->closeBracket).kind = TVar13;
  (pUVar17->closeBracket).field_0x2 = uVar14;
  (pUVar17->closeBracket).numFlags = (NumericTokenFlags)NVar15.raw;
  (pUVar17->closeBracket).rawLen = uVar16;
  (pUVar17->closeBracket).info = pIVar4;
  (pUVar17->expr).ptr = args_4;
  if (pSVar1 != (SelectorSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pUVar17;
  }
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pUVar17;
  return pUVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }